

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotorLinearDriveline.cpp
# Opt level: O1

void __thiscall
chrono::ChLinkMotorLinearDriveline::Update
          (ChLinkMotorLinearDriveline *this,double mytime,bool update_assets)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  ChBodyFrame *pCVar38;
  ChBodyFrame *pCVar39;
  element_type *peVar40;
  element_type *peVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  bool bVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  double dVar76;
  double dVar77;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  ChVector<double> abs_shaft2_rotation_dir;
  ChVector<double> abs_shaftdir;
  ChCoordsys<double> local_88;
  ulong local_50;
  double local_48;
  ulong local_40;
  ulong local_38;
  double local_30;
  ulong local_28;
  
  ChLinkMotorLinear::Update(&this->super_ChLinkMotorLinear,mytime,update_assets);
  (**(code **)(*(long *)&(this->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric.
                         super_ChLinkMate.super_ChLink.super_ChLinkBase.super_ChPhysicsItem + 0x1f8)
  )(&local_88,this);
  ChCoordsys<double>::TransformDirectionLocalToParent(&local_88,(ChVector<double> *)&VECT_X);
  auVar49._8_8_ = 0;
  auVar49._0_8_ = local_38;
  pCVar38 = (this->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric.
            super_ChLinkMate.super_ChLink.Body1;
  pCVar39 = (this->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric.
            super_ChLinkMate.super_ChLink.Body2;
  auVar20._8_8_ = 0;
  auVar20._0_8_ =
       (pCVar38->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar78._8_8_ = 0;
  auVar78._0_8_ =
       local_30 *
       *(double *)
        ((long)&(pCVar38->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x18
        );
  auVar20 = vfmadd231sd_fma(auVar78,auVar49,auVar20);
  auVar70._8_8_ = 0;
  auVar70._0_8_ = local_28;
  auVar21._8_8_ = 0;
  auVar21._0_8_ =
       *(double *)
        ((long)&(pCVar38->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x30
        );
  auVar20 = vfmadd231sd_fma(auVar20,auVar70,auVar21);
  auVar22._8_8_ = 0;
  auVar22._0_8_ =
       *(double *)
        ((long)&(pCVar38->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 8);
  auVar79._8_8_ = 0;
  auVar79._0_8_ =
       local_30 *
       *(double *)
        ((long)&(pCVar38->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x20
        );
  auVar21 = vfmadd231sd_fma(auVar79,auVar49,auVar22);
  auVar23._8_8_ = 0;
  auVar23._0_8_ =
       *(double *)
        ((long)&(pCVar38->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x38
        );
  auVar21 = vfmadd231sd_fma(auVar21,auVar70,auVar23);
  dVar76 = auVar21._0_8_;
  auVar24._8_8_ = 0;
  auVar24._0_8_ =
       *(double *)
        ((long)&(pCVar38->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x10
        );
  auVar80._8_8_ = 0;
  auVar80._0_8_ =
       local_30 *
       *(double *)
        ((long)&(pCVar38->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x28
        );
  auVar21 = vfmadd231sd_fma(auVar80,auVar49,auVar24);
  auVar25._8_8_ = 0;
  auVar25._0_8_ =
       *(double *)
        ((long)&(pCVar38->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x40
        );
  auVar21 = vfmadd231sd_fma(auVar21,auVar70,auVar25);
  auVar26._8_8_ = 0;
  auVar26._0_8_ =
       (pCVar39->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar81._8_8_ = 0;
  auVar81._0_8_ =
       local_30 *
       *(double *)
        ((long)&(pCVar39->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x18
        );
  auVar22 = vfmadd231sd_fma(auVar81,auVar49,auVar26);
  auVar27._8_8_ = 0;
  auVar27._0_8_ =
       *(double *)
        ((long)&(pCVar39->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x30
        );
  auVar22 = vfmadd231sd_fma(auVar22,auVar70,auVar27);
  auVar28._8_8_ = 0;
  auVar28._0_8_ =
       *(double *)
        ((long)&(pCVar39->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 8);
  auVar82._8_8_ = 0;
  auVar82._0_8_ =
       local_30 *
       *(double *)
        ((long)&(pCVar39->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x20
        );
  auVar23 = vfmadd231sd_fma(auVar82,auVar49,auVar28);
  auVar29._8_8_ = 0;
  auVar29._0_8_ =
       *(double *)
        ((long)&(pCVar39->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x38
        );
  auVar23 = vfmadd231sd_fma(auVar23,auVar70,auVar29);
  dVar77 = auVar23._0_8_;
  auVar30._8_8_ = 0;
  auVar30._0_8_ =
       *(double *)
        ((long)&(pCVar39->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x10
        );
  auVar60._8_8_ = 0;
  auVar60._0_8_ =
       local_30 *
       *(double *)
        ((long)&(pCVar39->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x28
        );
  auVar23 = vfmadd231sd_fma(auVar60,auVar49,auVar30);
  auVar31._8_8_ = 0;
  auVar31._0_8_ =
       *(double *)
        ((long)&(pCVar39->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x40
        );
  auVar23 = vfmadd231sd_fma(auVar23,auVar70,auVar31);
  auVar66._0_8_ = auVar23._0_8_;
  (**(code **)(*(long *)&(this->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric.
                         super_ChLinkMate.super_ChLink.super_ChLinkBase.super_ChPhysicsItem + 0x1f8)
  )(&local_88,this);
  dVar42 = local_88.pos.m_data[2];
  dVar44 = local_88.pos.m_data[1];
  dVar43 = local_88.pos.m_data[0];
  dVar47 = (pCVar38->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[0];
  dVar48 = (pCVar38->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[1];
  dVar1 = (pCVar38->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[2];
  dVar2 = (pCVar38->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
          super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  dVar3 = *(double *)
           ((long)&(pCVar38->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data +
           0x18);
  dVar4 = *(double *)
           ((long)&(pCVar38->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data +
           0x30);
  dVar5 = *(double *)
           ((long)&(pCVar38->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 8
           );
  dVar6 = *(double *)
           ((long)&(pCVar38->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data +
           0x20);
  dVar7 = *(double *)
           ((long)&(pCVar38->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data +
           0x38);
  dVar8 = *(double *)
           ((long)&(pCVar38->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data +
           0x10);
  dVar9 = *(double *)
           ((long)&(pCVar38->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data +
           0x28);
  dVar10 = *(double *)
            ((long)&(pCVar38->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                    super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data +
            0x40);
  pCVar38 = (this->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric.
            super_ChLinkMate.super_ChLink.Body2;
  (**(code **)(*(long *)&(this->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric.
                         super_ChLinkMate.super_ChLink.super_ChLinkBase.super_ChPhysicsItem + 0x1f8)
  )(&local_88,this);
  local_88.pos.m_data[0] =
       local_88.pos.m_data[0] -
       (pCVar38->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[0];
  local_88.pos.m_data[1] =
       local_88.pos.m_data[1] -
       (pCVar38->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[1];
  local_88.pos.m_data[2] =
       local_88.pos.m_data[2] -
       (pCVar38->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[2];
  auVar32._8_8_ = 0;
  auVar32._0_8_ =
       (pCVar38->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar50._8_8_ = 0;
  auVar50._0_8_ = local_88.pos.m_data[0];
  auVar83._8_8_ = 0;
  auVar83._0_8_ =
       local_88.pos.m_data[1] *
       *(double *)
        ((long)&(pCVar38->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x18
        );
  auVar23 = vfmadd231sd_fma(auVar83,auVar50,auVar32);
  auVar33._8_8_ = 0;
  auVar33._0_8_ =
       *(double *)
        ((long)&(pCVar38->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x30
        );
  auVar71._8_8_ = 0;
  auVar71._0_8_ = local_88.pos.m_data[2];
  auVar23 = vfmadd231sd_fma(auVar23,auVar71,auVar33);
  auVar34._8_8_ = 0;
  auVar34._0_8_ =
       *(double *)
        ((long)&(pCVar38->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 8);
  auVar84._8_8_ = 0;
  auVar84._0_8_ =
       local_88.pos.m_data[1] *
       *(double *)
        ((long)&(pCVar38->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x20
        );
  auVar24 = vfmadd231sd_fma(auVar84,auVar50,auVar34);
  auVar35._8_8_ = 0;
  auVar35._0_8_ =
       *(double *)
        ((long)&(pCVar38->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x38
        );
  auVar24 = vfmadd231sd_fma(auVar24,auVar71,auVar35);
  auVar36._8_8_ = 0;
  auVar36._0_8_ =
       *(double *)
        ((long)&(pCVar38->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x10
        );
  auVar51._8_8_ = 0;
  auVar51._0_8_ = local_88.pos.m_data[0];
  auVar61._8_8_ = 0;
  auVar61._0_8_ =
       local_88.pos.m_data[1] *
       *(double *)
        ((long)&(pCVar38->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x28
        );
  auVar25 = vfmadd231sd_fma(auVar61,auVar51,auVar36);
  auVar37._8_8_ = 0;
  auVar37._0_8_ =
       *(double *)
        ((long)&(pCVar38->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x40
        );
  auVar72._8_8_ = 0;
  auVar72._0_8_ = local_88.pos.m_data[2];
  auVar25 = vfmadd231sd_fma(auVar25,auVar72,auVar37);
  (**(code **)(*(long *)&(this->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric.
                         super_ChLinkMate.super_ChLink.super_ChLinkBase.super_ChPhysicsItem + 0x1f8)
  )(&local_88,this);
  ChCoordsys<double>::TransformDirectionLocalToParent(&local_88,&this->shaft2_rotation_dir);
  pCVar38 = (this->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric.
            super_ChLinkMate.super_ChLink.Body2;
  dVar11 = (pCVar38->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
           super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  dVar12 = *(double *)
            ((long)&(pCVar38->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                    super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data +
            8);
  dVar13 = *(double *)
            ((long)&(pCVar38->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                    super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data +
            0x18);
  dVar14 = *(double *)
            ((long)&(pCVar38->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                    super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data +
            0x30);
  dVar15 = *(double *)
            ((long)&(pCVar38->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                    super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data +
            0x20);
  dVar16 = *(double *)
            ((long)&(pCVar38->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                    super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data +
            0x38);
  dVar17 = *(double *)
            ((long)&(pCVar38->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                    super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data +
            0x10);
  dVar18 = *(double *)
            ((long)&(pCVar38->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                    super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data +
            0x28);
  dVar19 = *(double *)
            ((long)&(pCVar38->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                    super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data +
            0x40);
  peVar40 = (this->innerconstraint1lin).
            super___shared_ptr<chrono::ChShaftsBodyTranslation,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  auVar89._8_8_ = 0;
  auVar89._0_8_ = auVar20._0_8_;
  auVar52._8_8_ = 0;
  auVar52._0_8_ = dVar76 * dVar76;
  auVar26 = vfmadd231sd_fma(auVar52,auVar89,auVar89);
  auVar90._8_8_ = 0;
  auVar90._0_8_ = auVar21._0_8_;
  auVar26 = vfmadd231sd_fma(auVar26,auVar90,auVar90);
  if (auVar26._0_8_ < 0.0) {
    dVar46 = sqrt(auVar26._0_8_);
  }
  else {
    auVar26 = vsqrtsd_avx(auVar26,auVar26);
    dVar46 = auVar26._0_8_;
  }
  bVar45 = 2.2250738585072014e-308 <= dVar46;
  dVar46 = 1.0 / dVar46;
  (peVar40->shaft_dir).m_data[0] =
       (double)((ulong)bVar45 * (long)(dVar46 * auVar20._0_8_) + (ulong)!bVar45 * 0x3ff0000000000000
               );
  (peVar40->shaft_dir).m_data[1] = (double)((ulong)bVar45 * (long)(dVar46 * dVar76));
  (peVar40->shaft_dir).m_data[2] = (double)((ulong)bVar45 * (long)(dVar46 * auVar21._0_8_));
  peVar40 = (this->innerconstraint1lin).
            super___shared_ptr<chrono::ChShaftsBodyTranslation,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  dVar42 = dVar42 - dVar1;
  dVar43 = dVar43 - dVar47;
  dVar44 = dVar44 - dVar48;
  auVar91._8_8_ = 0;
  auVar91._0_8_ = dVar8;
  auVar62._8_8_ = 0;
  auVar62._0_8_ = dVar43;
  auVar85._8_8_ = 0;
  auVar85._0_8_ = dVar44 * dVar9;
  auVar20 = vfmadd213sd_fma(auVar91,auVar62,auVar85);
  auVar94._8_8_ = 0;
  auVar94._0_8_ = dVar10;
  auVar53._8_8_ = 0;
  auVar53._0_8_ = dVar42;
  auVar20 = vfmadd213sd_fma(auVar94,auVar53,auVar20);
  auVar96._8_8_ = 0;
  auVar96._0_8_ = dVar5;
  auVar86._8_8_ = 0;
  auVar86._0_8_ = dVar44 * dVar6;
  auVar21 = vfmadd213sd_fma(auVar96,auVar62,auVar86);
  auVar92._8_8_ = 0;
  auVar92._0_8_ = dVar7;
  auVar21 = vfmadd213sd_fma(auVar92,auVar53,auVar21);
  auVar87._8_8_ = 0;
  auVar87._0_8_ = dVar2;
  auVar63._8_8_ = 0;
  auVar63._0_8_ = dVar43;
  auVar73._8_8_ = 0;
  auVar73._0_8_ = dVar44 * dVar3;
  auVar26 = vfmadd213sd_fma(auVar87,auVar63,auVar73);
  auVar64._8_8_ = 0;
  auVar64._0_8_ = dVar4;
  auVar54._8_8_ = 0;
  auVar54._0_8_ = dVar42;
  auVar26 = vfmadd213sd_fma(auVar64,auVar54,auVar26);
  (peVar40->shaft_pos).m_data[0] = auVar26._0_8_;
  (peVar40->shaft_pos).m_data[1] = auVar21._0_8_;
  (peVar40->shaft_pos).m_data[2] = auVar20._0_8_;
  peVar40 = (this->innerconstraint2lin).
            super___shared_ptr<chrono::ChShaftsBodyTranslation,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  auVar65._8_8_ = 0;
  auVar65._0_8_ = auVar22._0_8_;
  auVar55._8_8_ = 0;
  auVar55._0_8_ = dVar77 * dVar77;
  auVar20 = vfmadd231sd_fma(auVar55,auVar65,auVar65);
  auVar66._8_8_ = 0;
  auVar20 = vfmadd231sd_fma(auVar20,auVar66,auVar66);
  if (auVar20._0_8_ < 0.0) {
    dVar47 = sqrt(auVar20._0_8_);
  }
  else {
    auVar20 = vsqrtsd_avx(auVar20,auVar20);
    dVar47 = auVar20._0_8_;
  }
  auVar93._8_8_ = 0;
  auVar93._0_8_ = dVar19;
  bVar45 = 2.2250738585072014e-308 <= dVar47;
  dVar47 = 1.0 / dVar47;
  (peVar40->shaft_dir).m_data[0] =
       (double)((ulong)bVar45 * (long)(dVar47 * auVar22._0_8_) + (ulong)!bVar45 * 0x3ff0000000000000
               );
  (peVar40->shaft_dir).m_data[1] = (double)((ulong)bVar45 * (long)(dVar47 * dVar77));
  (peVar40->shaft_dir).m_data[2] = (double)((ulong)bVar45 * (long)(dVar47 * auVar66._0_8_));
  peVar40 = (this->innerconstraint2lin).
            super___shared_ptr<chrono::ChShaftsBodyTranslation,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (peVar40->shaft_pos).m_data[0] = auVar23._0_8_;
  (peVar40->shaft_pos).m_data[1] = auVar24._0_8_;
  (peVar40->shaft_pos).m_data[2] = auVar25._0_8_;
  auVar74._8_8_ = 0;
  auVar74._0_8_ = local_50;
  auVar67._8_8_ = 0;
  auVar67._0_8_ = dVar17;
  auVar56._8_8_ = 0;
  auVar56._0_8_ = local_48 * dVar18;
  auVar20 = vfmadd213sd_fma(auVar67,auVar74,auVar56);
  auVar95._8_8_ = 0;
  auVar95._0_8_ = local_40;
  auVar20 = vfmadd213sd_fma(auVar93,auVar95,auVar20);
  auVar68._8_8_ = 0;
  auVar68._0_8_ = dVar12;
  auVar57._8_8_ = 0;
  auVar57._0_8_ = local_48 * dVar15;
  auVar21 = vfmadd213sd_fma(auVar68,auVar74,auVar57);
  auVar88._8_8_ = 0;
  auVar88._0_8_ = dVar16;
  auVar21 = vfmadd213sd_fma(auVar88,auVar95,auVar21);
  dVar47 = auVar21._0_8_;
  auVar69._8_8_ = 0;
  auVar69._0_8_ = dVar11;
  auVar58._8_8_ = 0;
  auVar58._0_8_ = local_48 * dVar13;
  auVar21 = vfmadd213sd_fma(auVar69,auVar74,auVar58);
  auVar75._8_8_ = 0;
  auVar75._0_8_ = dVar14;
  auVar21 = vfmadd213sd_fma(auVar75,auVar95,auVar21);
  peVar41 = (this->innerconstraint2rot).
            super___shared_ptr<chrono::ChShaftsBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  auVar59._8_8_ = 0;
  auVar59._0_8_ = dVar47 * dVar47;
  auVar22 = vfmadd231sd_fma(auVar59,auVar21,auVar21);
  auVar22 = vfmadd231sd_fma(auVar22,auVar20,auVar20);
  if (auVar22._0_8_ < 0.0) {
    dVar48 = sqrt(auVar22._0_8_);
  }
  else {
    auVar22 = vsqrtsd_avx(auVar22,auVar22);
    dVar48 = auVar22._0_8_;
  }
  bVar45 = 2.2250738585072014e-308 <= dVar48;
  dVar48 = 1.0 / dVar48;
  (peVar41->shaft_dir).m_data[0] =
       (double)((ulong)bVar45 * (long)(auVar21._0_8_ * dVar48) + (ulong)!bVar45 * 0x3ff0000000000000
               );
  (peVar41->shaft_dir).m_data[1] = (double)((ulong)bVar45 * (long)(dVar47 * dVar48));
  (peVar41->shaft_dir).m_data[2] = (double)((ulong)bVar45 * (long)(auVar20._0_8_ * dVar48));
  return;
}

Assistant:

void ChLinkMotorLinearDriveline::Update(double mytime, bool update_assets) {
    // Inherit parent class:
    ChLinkMotorLinear::Update(mytime, update_assets);

    // Update the direction of 1D-3D ChShaftBody constraints:
    ChVector<> abs_shaftdir = this->GetLinkAbsoluteCoords().TransformDirectionLocalToParent(VECT_X);
    ChVector<> shaftdir_b1 = this->Body1->TransformDirectionParentToLocal(abs_shaftdir);
    ChVector<> shaftdir_b2 = this->Body2->TransformDirectionParentToLocal(abs_shaftdir);
    ChVector<> shaftpos_b1 = this->Body1->TransformPointParentToLocal(this->GetLinkAbsoluteCoords().pos);
    ChVector<> shaftpos_b2 = this->Body2->TransformPointParentToLocal(this->GetLinkAbsoluteCoords().pos);
    ChVector<> abs_shaft2_rotation_dir =
        this->GetLinkAbsoluteCoords().TransformDirectionLocalToParent(this->shaft2_rotation_dir);
    ChVector<> shaftdir_b2rot = this->Body2->TransformDirectionParentToLocal(abs_shaft2_rotation_dir);

    innerconstraint1lin->SetShaftDirection(shaftdir_b1);
    innerconstraint1lin->SetShaftPos(shaftpos_b1);

    innerconstraint2lin->SetShaftDirection(shaftdir_b2);
    innerconstraint2lin->SetShaftPos(shaftpos_b2);

    innerconstraint2rot->SetShaftDirection(shaftdir_b2rot);
}